

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detail_primitive_types.h
# Opt level: O1

void dukglue::types::DukType<std::vector<Dog*,std::allocator<Dog*>>>::
     push<std::vector<Dog*,std::allocator<Dog*>>>
               (duk_context *ctx,vector<Dog_*,_std::allocator<Dog_*>_> *value)

{
  duk_idx_t obj_idx;
  pointer ppDVar1;
  ulong uVar2;
  
  obj_idx = duk_push_array(ctx);
  ppDVar1 = (value->super__Vector_base<Dog_*,_std::allocator<Dog_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((value->super__Vector_base<Dog_*,_std::allocator<Dog_*>_>)._M_impl.super__Vector_impl_data.
      _M_finish != ppDVar1) {
    uVar2 = 0;
    do {
      if (ppDVar1[uVar2] == (Dog *)0x0) {
        duk_push_null(ctx);
      }
      else {
        DukType<Dog>::push<Dog&,void>(ctx,ppDVar1[uVar2]);
      }
      duk_put_prop_index(ctx,obj_idx,(duk_uarridx_t)uVar2);
      uVar2 = uVar2 + 1;
      ppDVar1 = (value->super__Vector_base<Dog_*,_std::allocator<Dog_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar2 < (ulong)((long)(value->super__Vector_base<Dog_*,_std::allocator<Dog_*>_>).
                                   _M_impl.super__Vector_impl_data._M_finish - (long)ppDVar1 >> 3));
  }
  return;
}

Assistant:

static void push(duk_context* ctx, const std::vector<T>& value) {
				duk_idx_t obj_idx = duk_push_array(ctx);

				for (size_t i = 0; i < value.size(); i++) {
					DukType< typename Bare<T>::type >::template push<T>(ctx, value[i]);
					duk_put_prop_index(ctx, obj_idx, i);
				}
			}